

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::evaluate(Forth *this)

{
  uint sourceSize;
  uint Source;
  CAddr caddr;
  uint length;
  Forth *this_local;
  
  requireDStackDepth(this,2,"EVALUATE");
  SaveInput(this);
  sourceSize = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  Source = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  setSourceId(this,-1);
  setSourceVariables(this,Source,sourceSize,0);
  this->InterpretState = InterpretSource;
  return;
}

Assistant:

void evaluate() {
			REQUIRE_DSTACK_DEPTH(2, "EVALUATE");
			SaveInput();
			auto length = dStack.getTop(); dStack.pop();
			auto caddr = CADDR(dStack.getTop()); dStack.pop();
			setSourceId(-1);
			setSourceVariables(caddr, length, 0);
			InterpretState = InterpretSource;
		}